

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void __thiscall duckdb::Linenoise::EditDeletePrevWord(Linenoise *this)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = this->pos;
  if (sVar1 != 0) {
    sVar3 = sVar1;
    do {
      if ((0x20 < (ulong)(byte)this->buf[sVar3 - 1]) ||
         ((0x100002600U >> ((ulong)(byte)this->buf[sVar3 - 1] & 0x3f) & 1) == 0)) {
        pcVar2 = this->buf;
        goto LAB_00214543;
      }
      sVar3 = sVar3 - 1;
      this->pos = sVar3;
    } while (sVar3 != 0);
  }
  pcVar2 = this->buf;
  goto LAB_00214510;
  while( true ) {
    sVar3 = sVar3 - 1;
    this->pos = sVar3;
    if (sVar3 == 0) break;
LAB_00214543:
    if (((ulong)(byte)pcVar2[sVar3 - 1] < 0x21) &&
       ((0x100002600U >> ((ulong)(byte)pcVar2[sVar3 - 1] & 0x3f) & 1) != 0)) goto LAB_00214513;
  }
LAB_00214510:
  sVar3 = 0;
LAB_00214513:
  memmove(pcVar2 + sVar3,pcVar2 + sVar1,(this->len - sVar1) + 1);
  this->len = this->len + (sVar3 - sVar1);
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditDeletePrevWord() {
	size_t old_pos = pos;
	size_t diff;

	while (pos > 0 && IsSpace(buf[pos - 1])) {
		pos--;
	}
	while (pos > 0 && !IsSpace(buf[pos - 1])) {
		pos--;
	}
	diff = old_pos - pos;
	memmove(buf + pos, buf + old_pos, len - old_pos + 1);
	len -= diff;
	RefreshLine();
}